

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHashedSimplePairCache.cpp
# Opt level: O2

btSimplePair * __thiscall
btHashedSimplePairCache::internalAddPair(btHashedSimplePairCache *this,int indexA,int indexB)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  uint uVar4;
  btSimplePair *pbVar5;
  
  uVar4 = getHash(this,indexA,indexB);
  uVar4 = (this->m_overlappingPairArray).m_capacity - 1U & uVar4;
  pbVar5 = internalFindPair(this,indexA,indexB,uVar4);
  if (pbVar5 == (btSimplePair *)0x0) {
    iVar1 = (this->m_overlappingPairArray).m_size;
    iVar2 = (this->m_overlappingPairArray).m_capacity;
    pbVar5 = btAlignedObjectArray<btSimplePair>::expandNonInitializing
                       (&this->m_overlappingPairArray);
    if (iVar2 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar4 = getHash(this,indexA,indexB);
      uVar4 = (this->m_overlappingPairArray).m_capacity - 1U & uVar4;
    }
    pbVar5->m_indexA = indexA;
    pbVar5->m_indexB = indexB;
    (pbVar5->field_2).m_userPointer = (void *)0x0;
    piVar3 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar1] = piVar3[(int)uVar4];
    piVar3[(int)uVar4] = iVar1;
  }
  return pbVar5;
}

Assistant:

btSimplePair* btHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{

	int	hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));	// New hash value with new mask


	btSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA),static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity()-1));
	}
	
	pair = new (mem) btSimplePair(indexA,indexB);

	pair->m_userPointer = 0;
	
	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}